

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sequence.hpp
# Opt level: O0

void __thiscall biosoup::Sequence::ReverseAndComplement(Sequence *this)

{
  bool bVar1;
  int iVar2;
  byte *pbVar3;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Var4;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Var5;
  char *it;
  iterator __end2;
  iterator __begin2;
  string *__range2;
  Sequence *this_local;
  
  __end2._M_current = (char *)std::__cxx11::string::begin();
  it = (char *)std::__cxx11::string::end();
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end2,(__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                     *)&it), bVar1) {
    pbVar3 = (byte *)__gnu_cxx::
                     __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     ::operator*(&__end2);
    iVar2 = toupper((uint)*pbVar3);
    switch((char)iVar2) {
    case 'A':
      *pbVar3 = 0x54;
      break;
    case 'B':
      *pbVar3 = 0x56;
      break;
    case 'C':
      *pbVar3 = 0x47;
      break;
    case 'D':
      *pbVar3 = 0x48;
      break;
    default:
      break;
    case 'G':
      *pbVar3 = 0x43;
      break;
    case 'H':
      *pbVar3 = 0x44;
      break;
    case 'K':
      *pbVar3 = 0x4d;
      break;
    case 'M':
      *pbVar3 = 0x4b;
      break;
    case 'R':
      *pbVar3 = 0x59;
      break;
    case 'S':
      break;
    case 'T':
    case 'U':
      *pbVar3 = 0x41;
      break;
    case 'V':
      *pbVar3 = 0x42;
      break;
    case 'W':
      break;
    case 'Y':
      *pbVar3 = 0x52;
    }
    __gnu_cxx::
    __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator++(&__end2);
  }
  _Var4._M_current = (char *)std::__cxx11::string::begin();
  _Var5._M_current = (char *)std::__cxx11::string::end();
  std::reverse<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>(_Var4,_Var5);
  _Var4._M_current = (char *)std::__cxx11::string::begin();
  _Var5._M_current = (char *)std::__cxx11::string::end();
  std::reverse<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>(_Var4,_Var5);
  return;
}

Assistant:

void ReverseAndComplement() {  // (optional) Watson-Crick base pairing
    for (auto& it : data) {
      switch (static_cast<char>(std::toupper(static_cast<unsigned char>(it)))) {
        case 'A': it = 'T'; break;
        case 'C': it = 'G'; break;
        case 'G': it = 'C'; break;
        case 'T': case 'U': it = 'A'; break;
        case 'R': it = 'Y'; break;  // A || G
        case 'Y': it = 'R'; break;  // C || T (U)
        case 'K': it = 'M'; break;  // G || T (U)
        case 'M': it = 'K'; break;  // A || C
        case 'S': break;  // C || G
        case 'W': break;  // A || T (U)
        case 'B': it = 'V'; break;  // !A
        case 'D': it = 'H'; break;  // !C
        case 'H': it = 'D'; break;  // !G
        case 'V': it = 'B'; break;  // !T (!U)
        default: break;  // N || -
      }
    }
    std::reverse(data.begin(), data.end());
    std::reverse(quality.begin(), quality.end());
  }